

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_xc_1d_ehwlrg.c
# Opt level: O0

void lda_xc_1d_ehwlrg_init(xc_func_type *p)

{
  int iVar1;
  undefined8 *puVar2;
  void *pvVar3;
  undefined8 *in_RDI;
  lda_xc_1d_ehwlrg_params *params;
  
  pvVar3 = malloc(0x20);
  in_RDI[0x2f] = pvVar3;
  puVar2 = (undefined8 *)in_RDI[0x2f];
  iVar1 = *(int *)*in_RDI;
  if (iVar1 == 0x218) {
    *puVar2 = 0x3fe46a7ef9db22d1;
    puVar2[1] = 0xbfe9b22d0e560419;
    puVar2[2] = 0x3fea3d70a3d70a3d;
    puVar2[3] = 0xbfde147ae147ae14;
  }
  else if (iVar1 == 0x219) {
    *puVar2 = 0x3fe353f7ced91687;
    puVar2[1] = 0xbfe7ae147ae147ae;
    puVar2[2] = 0x3fe5c28f5c28f5c3;
    puVar2[3] = 0xbfd851eb851eb852;
  }
  else if (iVar1 == 0x21a) {
    *puVar2 = 0x3fe3851eb851eb85;
    puVar2[1] = 0xbfe8a3d70a3d70a4;
    puVar2[2] = 0x3fe947ae147ae148;
    puVar2[3] = 0xbfdeb851eb851eb8;
  }
  return;
}

Assistant:

static void
lda_xc_1d_ehwlrg_init(xc_func_type *p)
{
  lda_xc_1d_ehwlrg_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(lda_xc_1d_ehwlrg_params));
  params = (lda_xc_1d_ehwlrg_params *) (p->params);

  switch(p->info->number){
  case XC_LDA_XC_1D_EHWLRG_1:
    params->alpha =  0.638;
    params->a1    = -0.803;
    params->a2    =  0.82;
    params->a3    = -0.47;
    break;
  case XC_LDA_XC_1D_EHWLRG_2:
    params->alpha =  0.604;
    params->a1    = -0.74;
    params->a2    =  0.68;
    params->a3    = -0.38;
    break;
  case XC_LDA_XC_1D_EHWLRG_3:
    params->alpha =  0.61;
    params->a1    = -0.77;
    params->a2    =  0.79;
    params->a3    = -0.48;
    break;
  }
}